

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<kj::_::HashBucket> * __thiscall
kj::Array<kj::_::HashBucket>::operator=
          (Array<kj::_::HashBucket> *this,Array<kj::_::HashBucket> *other)

{
  Array<kj::_::HashBucket> *other_local;
  Array<kj::_::HashBucket> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->size_ = other->size_;
  this->disposer = other->disposer;
  other->ptr = (HashBucket *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline Array& operator=(Array&& other) {
    dispose();
    ptr = other.ptr;
    size_ = other.size_;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.size_ = 0;
    return *this;
  }